

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_create_array_reference_should_create_an_array_reference(void)

{
  cJSON *array;
  cJSON *item;
  cJSON *item_00;
  
  array = cJSON_CreateArray();
  item = cJSON_CreateNumber(42.0);
  if ((item == (cJSON *)0x0) || ((char)item->type != '\b')) {
    UnityFail(" Expected TRUE Was FALSE",0x209);
  }
  if ((array == (cJSON *)0x0) || ((char)array->type != ' ')) {
    UnityFail(" Expected TRUE Was FALSE",0x20a);
  }
  add_item_to_array(array,item);
  item_00 = cJSON_CreateArrayReference(item);
  if (item_00->child != item) {
    UnityFail(" Expected TRUE Was FALSE",0x20e);
  }
  UnityAssertEqualNumber(0x120,(long)item_00->type,(char *)0x0,0x20f,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(array);
  cJSON_Delete(item_00);
  return;
}

Assistant:

static void cjson_create_array_reference_should_create_an_array_reference(void) {
    cJSON *number_reference = NULL;
    cJSON *number_array = cJSON_CreateArray();
    cJSON *number = cJSON_CreateNumber(42);

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsArray(number_array));
    cJSON_AddItemToArray(number_array, number);

    number_reference = cJSON_CreateArrayReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Array | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_array);
    cJSON_Delete(number_reference);
}